

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

int secp256k1_fe_is_square_var(secp256k1_fe *x)

{
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  secp256k1_gej *psVar3;
  secp256k1_gej *psVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  secp256k1_scalar *a;
  int iVar8;
  secp256k1_ge *psVar9;
  secp256k1_ge *psVar10;
  secp256k1_gej *psVar11;
  long lVar12;
  uint64_t *t;
  uint uVar13;
  code *unaff_RBP;
  secp256k1_ge *in_RSI;
  secp256k1_ge *psVar14;
  ulong uVar15;
  secp256k1_gej *r;
  uint64_t *puVar16;
  uint64_t *puVar17;
  secp256k1_gej *psVar18;
  secp256k1_ge *psVar19;
  int iVar20;
  secp256k1_gej *psVar21;
  secp256k1_ge *unaff_R12;
  secp256k1_gej *unaff_R13;
  secp256k1_gej *psVar22;
  secp256k1_gej *psVar23;
  secp256k1_ge *unaff_R14;
  secp256k1_ge *psVar24;
  secp256k1_fe *psVar25;
  secp256k1_gej *unaff_R15;
  secp256k1_gej *psVar26;
  ulong uVar27;
  bool bVar28;
  secp256k1_fe sqrt;
  secp256k1_fe tmp;
  secp256k1_modinv64_signed62 s;
  ulong uStack_1008;
  undefined1 auStack_ff8 [32];
  undefined1 auStack_fd8 [88];
  uint64_t uStack_f80;
  uint64_t uStack_f78;
  uint64_t uStack_f70;
  uint64_t uStack_f68;
  int iStack_f60;
  int iStack_f5c;
  secp256k1_fe sStack_f58;
  undefined4 uStack_f28;
  secp256k1_fe sStack_f18;
  secp256k1_scalar sStack_ee8;
  secp256k1_ge sStack_ec8;
  secp256k1_fe asStack_e30 [31];
  secp256k1_ge sStack_848;
  secp256k1_fe asStack_7b0 [31];
  secp256k1_ge *psStack_1c0;
  secp256k1_ge *psStack_1b8;
  secp256k1_gej *psStack_1b0;
  secp256k1_ge *psStack_1a8;
  secp256k1_gej *psStack_1a0;
  code *pcStack_198;
  undefined1 auStack_190 [128];
  secp256k1_gej *psStack_110;
  secp256k1_ge *psStack_108;
  secp256k1_gej *psStack_100;
  secp256k1_ge *psStack_f8;
  undefined1 local_c8 [56];
  ulong uStack_90;
  ulong local_88;
  uint64_t uStack_80;
  uint64_t local_78;
  int iStack_70;
  int iStack_6c;
  secp256k1_modinv64_signed62 local_68;
  secp256k1_fe local_40;
  
  bVar6 = 0;
  r = (secp256k1_gej *)local_c8;
  psVar26 = (secp256k1_gej *)local_c8;
  psVar9 = (secp256k1_ge *)local_c8;
  local_c8._48_8_ = x->n[0];
  uStack_90 = x->n[1];
  local_88 = x->n[2];
  uStack_80 = x->n[3];
  local_78 = x->n[4];
  iStack_70 = x->magnitude;
  iStack_6c = x->normalized;
  secp256k1_fe_verify(x);
  local_c8._0_8_ = x->n[0];
  local_c8._8_8_ = x->n[1];
  local_c8._16_8_ = x->n[2];
  local_c8._24_8_ = x->n[3];
  local_c8._32_8_ = x->n[4];
  local_c8._40_4_ = x->magnitude;
  local_c8._44_4_ = x->normalized;
  secp256k1_fe_normalize_var((secp256k1_fe *)local_c8);
  secp256k1_fe_verify((secp256k1_fe *)local_c8);
  if (local_c8._44_4_ == 0) {
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((local_c8._16_8_ == 0 && local_c8._24_8_ == 0) &&
        (local_c8._8_8_ == 0 && local_c8._0_8_ == 0)) && local_c8._32_8_ == 0) {
      psVar9 = (secp256k1_ge *)0x1;
    }
    else {
      local_68.v[0] = (local_c8._8_8_ << 0x34 | local_c8._0_8_) & 0x3fffffffffffffff;
      local_68.v[1] = (ulong)((uint)local_c8._16_8_ & 0xfffff) << 0x2a | (ulong)local_c8._8_8_ >> 10
      ;
      local_68.v[2] =
           (ulong)((uint)local_c8._24_8_ & 0x3fffffff) << 0x20 | (ulong)local_c8._16_8_ >> 0x14;
      local_68.v[3] = (local_c8._32_8_ & 0xffffffffff) << 0x16 | (ulong)local_c8._24_8_ >> 0x1e;
      local_68.v[4] = (ulong)local_c8._32_8_ >> 0x28;
      uVar1 = secp256k1_jacobi64_maybe_var(&local_68,&secp256k1_const_modinfo_fe);
      if (uVar1 == 0) {
        uVar1 = secp256k1_fe_sqrt(&local_40,(secp256k1_fe *)local_c8);
        psVar9 = (secp256k1_ge *)(ulong)uVar1;
      }
      else {
        psVar9 = (secp256k1_ge *)(ulong)(~uVar1 >> 0x1f);
      }
    }
    unaff_R14 = (secp256k1_ge *)(local_c8 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    local_c8._48_8_ = (local_78 >> 0x30) * 0x1000003d1 + local_c8._48_8_;
    uStack_90 = ((ulong)local_c8._48_8_ >> 0x34) + uStack_90;
    local_88 = (uStack_90 >> 0x34) + local_88;
    uVar15 = (local_88 >> 0x34) + uStack_80;
    uStack_80 = uVar15 & 0xfffffffffffff;
    local_78 = (uVar15 >> 0x34) + (local_78 & 0xffffffffffff);
    local_88 = local_88 & 0xfffffffffffff;
    uStack_90 = uStack_90 & 0xfffffffffffff;
    local_c8._48_8_ = local_c8._48_8_ & 0xfffffffffffff;
    iStack_70 = 1;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    in_RSI = unaff_R14;
    iVar2 = secp256k1_fe_sqrt((secp256k1_fe *)local_c8,(secp256k1_fe *)unaff_R14);
    r = psVar26;
    if ((int)psVar9 == iVar2) {
      return (int)psVar9;
    }
  }
  secp256k1_fe_is_square_var_cold_1();
  psStack_f8 = psVar9;
  psVar22 = (secp256k1_gej *)auStack_190;
  psVar23 = (secp256k1_gej *)auStack_190;
  auStack_190._80_8_ = (in_RSI->x).n[4];
  psVar26 = (secp256k1_gej *)(in_RSI->x).n[0];
  auStack_190._64_8_ = (in_RSI->x).n[2];
  auStack_190._72_8_ = (in_RSI->x).n[3];
  auStack_190._48_8_ = psVar26;
  auStack_190._56_8_ = (in_RSI->x).n[1];
  auStack_190._0_8_ = (r->x).n[0];
  auStack_190._8_8_ = (r->x).n[1];
  auStack_190._16_8_ = (r->x).n[2];
  auStack_190._24_8_ = (r->x).n[3];
  auStack_190._32_8_ = (r->x).n[4];
  psVar14 = in_RSI;
  if (((((long)auStack_190._0_8_ < 0) || ((long)auStack_190._8_8_ < 0)) ||
      (psVar9 = in_RSI, psVar14 = (secp256k1_ge *)auStack_190._16_8_, (long)auStack_190._16_8_ < 0))
     || ((r = (secp256k1_gej *)auStack_190._24_8_, (long)auStack_190._24_8_ < 0 ||
         ((long)auStack_190._32_8_ < 0)))) {
LAB_00147dd8:
    pcStack_198 = (code *)0x147ddd;
    secp256k1_jacobi64_maybe_var_cold_18();
  }
  else {
    psVar14 = (secp256k1_ge *)
              (auStack_190._16_8_ | auStack_190._24_8_ | auStack_190._8_8_ | auStack_190._0_8_ |
              auStack_190._32_8_);
    if (psVar14 != (secp256k1_ge *)0x0) {
      unaff_R14 = (secp256k1_ge *)0x5;
      unaff_RBP = (code *)0xffffffffffffffff;
      auStack_190._104_8_ = 0;
      psVar10 = (secp256k1_ge *)0x0;
      auStack_190._96_8_ = in_RSI;
      do {
        psVar9 = (secp256k1_ge *)auStack_190._96_8_;
        r = (secp256k1_gej *)(auStack_190._56_8_ << 0x3e | (ulong)psVar26);
        puVar16 = (uint64_t *)(auStack_190._8_8_ << 0x3e | auStack_190._0_8_);
        psVar3 = (secp256k1_gej *)0x0;
        psVar19 = (secp256k1_ge *)0x0;
        psVar26 = (secp256k1_gej *)0x1;
        iVar2 = 0x3e;
        psVar24 = (secp256k1_ge *)0x1;
        puVar17 = puVar16;
        psVar21 = r;
        while( true ) {
          uVar15 = -1L << ((byte)iVar2 & 0x3f) | (ulong)puVar17;
          lVar12 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          bVar5 = (byte)lVar12;
          psVar18 = (secp256k1_gej *)((ulong)puVar17 >> (bVar5 & 0x3f));
          psVar24 = (secp256k1_ge *)((long)psVar24 << (bVar5 & 0x3f));
          psVar3 = (secp256k1_gej *)((long)psVar3 << (bVar5 & 0x3f));
          unaff_RBP = unaff_RBP + -lVar12;
          psVar14 = (secp256k1_ge *)((ulong)psVar21 >> 2);
          uVar1 = ((uint)((ulong)psVar21 >> 1) ^ (uint)psVar14) & (uint)lVar12 ^ (uint)psVar10;
          unaff_R12 = (secp256k1_ge *)(ulong)uVar1;
          iVar2 = iVar2 - (uint)lVar12;
          auStack_190._112_8_ = unaff_R14;
          if (iVar2 == 0) break;
          if (((ulong)psVar21 & 1) == 0) {
            pcStack_198 = (code *)0x147d8d;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_00147d8d:
            pcStack_198 = (code *)0x147d92;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_00147d92:
            pcStack_198 = (code *)0x147d97;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_00147d97:
            pcStack_198 = (code *)0x147d9c;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_00147d9c;
          }
          if (((ulong)psVar18 & 1) == 0) goto LAB_00147d8d;
          psVar14 = (secp256k1_ge *)((long)psVar3 * (long)puVar16 + (long)psVar24 * (long)r);
          bVar5 = 0x3e - (char)iVar2;
          psVar10 = (secp256k1_ge *)((long)psVar21 << (bVar5 & 0x3f));
          if (psVar14 != psVar10) goto LAB_00147d92;
          psVar10 = (secp256k1_ge *)((long)psVar26 * (long)puVar16 + (long)psVar19 * (long)r);
          psVar14 = (secp256k1_ge *)((long)psVar18 << (bVar5 & 0x3f));
          if (psVar10 != psVar14) goto LAB_00147d97;
          iVar20 = (int)psVar21;
          iVar8 = (int)psVar18;
          if ((long)unaff_RBP < 0) {
            unaff_RBP = (code *)-(long)unaff_RBP;
            iVar7 = (int)unaff_RBP + 1;
            if (iVar2 <= iVar7) {
              iVar7 = iVar2;
            }
            psVar14 = (secp256k1_ge *)(ulong)(iVar7 - 0x3fU);
            if (0xffffffc1 < iVar7 - 0x3fU) {
              psVar10 = (secp256k1_ge *)
                        (ulong)(uVar1 ^ (uint)(((ulong)psVar18 & (ulong)psVar21) >> 1));
              uVar15 = (ulong)(0x3fL << (-(char)iVar7 & 0x3fU)) >> (-(char)iVar7 & 0x3fU);
              uVar1 = (iVar8 * iVar8 + 0x3e) * iVar8 * iVar20 & (uint)uVar15;
              psVar4 = psVar3;
              psVar3 = psVar26;
              psVar11 = psVar18;
              psVar14 = psVar24;
              psVar24 = psVar19;
              goto LAB_00147b85;
            }
            goto LAB_00147da6;
          }
          iVar7 = (int)unaff_RBP + 1;
          if (iVar2 <= iVar7) {
            iVar7 = iVar2;
          }
          psVar14 = (secp256k1_ge *)(ulong)(iVar7 - 0x3fU);
          if (iVar7 - 0x3fU < 0xffffffc2) goto LAB_00147da1;
          uVar15 = (ulong)(0xfL << (-(char)iVar7 & 0x3fU)) >> (-(char)iVar7 & 0x3fU);
          uVar1 = -(iVar8 * ((iVar20 * 2 + 2U & 8) + iVar20)) & (uint)uVar15;
          psVar4 = psVar26;
          psVar11 = psVar21;
          psVar14 = psVar19;
          psVar21 = psVar18;
          psVar10 = unaff_R12;
LAB_00147b85:
          uVar27 = (ulong)uVar1;
          puVar17 = (uint64_t *)((long)(psVar21->x).n + uVar27 * (long)psVar11);
          psVar19 = (secp256k1_ge *)((long)(psVar14->x).n + (long)psVar24 * uVar27);
          psVar26 = (secp256k1_gej *)((long)(psVar4->x).n + uVar27 * (long)psVar3);
          psVar21 = psVar11;
          unaff_R12 = psVar10;
          if (((ulong)puVar17 & uVar15) != 0) {
LAB_00147d9c:
            pcStack_198 = (code *)0x147da1;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00147da1:
            pcStack_198 = (code *)0x147da6;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_00147da6:
            pcStack_198 = (code *)0x147dab;
            secp256k1_jacobi64_maybe_var_cold_5();
            goto LAB_00147dab;
          }
        }
        r = (secp256k1_gej *)((long)psVar3 * (long)psVar19);
        lVar12 = (long)psVar24 * (long)psVar26 - (long)r;
        uVar15 = (ulong)((secp256k1_gej *)((long)psVar24 * (long)psVar26) < r);
        uVar27 = SUB168(SEXT816((long)psVar24) * SEXT816((long)psVar26),8) -
                 SUB168(SEXT816((long)psVar3) * SEXT816((long)psVar19),8);
        auStack_190._120_8_ = psVar24;
        psStack_110 = psVar3;
        psStack_108 = psVar19;
        psStack_100 = psVar26;
        if ((lVar12 != 0x4000000000000000 || uVar27 != uVar15) &&
           (uVar27 - uVar15 != -1 || lVar12 != -0x4000000000000000)) {
LAB_00147dab:
          pcStack_198 = (code *)0x147db0;
          secp256k1_jacobi64_maybe_var_cold_16();
          psVar9 = psVar10;
          unaff_R14 = psVar24;
LAB_00147db0:
          pcStack_198 = (code *)0x147db5;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_00147db5:
          pcStack_198 = (code *)0x147dba;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_00147dba:
          pcStack_198 = (code *)0x147dbf;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00147dbf:
          pcStack_198 = (code *)0x147dc4;
          secp256k1_jacobi64_maybe_var_cold_12();
          psVar3 = (secp256k1_gej *)auStack_190;
LAB_00147dc4:
          pcStack_198 = (code *)0x147dc9;
          secp256k1_jacobi64_maybe_var_cold_11();
LAB_00147dc9:
          psVar22 = psVar3;
          pcStack_198 = (code *)0x147dce;
          secp256k1_jacobi64_maybe_var_cold_10();
LAB_00147dce:
          pcStack_198 = (code *)0x147dd3;
          secp256k1_jacobi64_maybe_var_cold_9();
          psVar23 = psVar22;
LAB_00147dd3:
          pcStack_198 = (code *)0x147dd8;
          secp256k1_jacobi64_maybe_var_cold_8();
          unaff_R13 = psVar23;
          unaff_R15 = psVar26;
          goto LAB_00147dd8;
        }
        psVar26 = (secp256k1_gej *)(auStack_190 + 0x30);
        iVar8 = (int)unaff_R14;
        pcStack_198 = (code *)0x147c2e;
        psVar14 = unaff_R14;
        r = psVar26;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar26,iVar8,
                           (secp256k1_modinv64_signed62 *)auStack_190._96_8_,0);
        if (iVar2 < 1) goto LAB_00147db0;
        pcStack_198 = (code *)0x147c49;
        psVar14 = unaff_R14;
        r = psVar26;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar26,iVar8,
                           (secp256k1_modinv64_signed62 *)psVar9,1);
        if (0 < iVar2) goto LAB_00147db5;
        pcStack_198 = (code *)0x147c61;
        psVar14 = unaff_R14;
        r = (secp256k1_gej *)auStack_190;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_190,iVar8,
                           (secp256k1_modinv64_signed62 *)psVar9,0);
        if (iVar2 < 1) goto LAB_00147dba;
        pcStack_198 = (code *)0x147c7c;
        psVar14 = unaff_R14;
        r = (secp256k1_gej *)auStack_190;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_190,iVar8,
                           (secp256k1_modinv64_signed62 *)psVar9,1);
        if (-1 < iVar2) goto LAB_00147dbf;
        pcStack_198 = (code *)0x147c97;
        secp256k1_modinv64_update_fg_62_var
                  (iVar8,(secp256k1_modinv64_signed62 *)psVar26,
                   (secp256k1_modinv64_signed62 *)auStack_190,
                   (secp256k1_modinv64_trans2x2 *)(auStack_190 + 0x78));
        psVar26 = (secp256k1_gej *)auStack_190._48_8_;
        if ((secp256k1_gej *)auStack_190._48_8_ == (secp256k1_gej *)0x1) {
          if (iVar8 < 2) {
LAB_00147d67:
            return 1 - (uVar1 * 2 & 2);
          }
          psVar14 = (secp256k1_ge *)0x1;
          uVar15 = 0;
          do {
            uVar15 = uVar15 | *(ulong *)(auStack_190 + (long)psVar14 * 8 + 0x30);
            psVar14 = (secp256k1_ge *)((long)(psVar14->x).n + 1);
          } while (unaff_R14 != psVar14);
          if (uVar15 == 0) goto LAB_00147d67;
        }
        lVar12 = (long)iVar8;
        if ((-1 < lVar12 + -2 && *(long *)(auStack_190 + lVar12 * 8 + 0x28) == 0) &&
            (&pcStack_198)[lVar12] == (code *)0x0) {
          unaff_R14 = (secp256k1_ge *)(ulong)(iVar8 - 1);
        }
        psVar3 = (secp256k1_gej *)(auStack_190 + 0x30);
        pcStack_198 = (code *)0x147cfe;
        iVar8 = (int)unaff_R14;
        psVar14 = unaff_R14;
        r = psVar3;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar3,iVar8,
                           (secp256k1_modinv64_signed62 *)psVar9,0);
        if (iVar2 < 1) goto LAB_00147dc4;
        pcStack_198 = (code *)0x147d19;
        psVar14 = unaff_R14;
        r = psVar3;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar3,iVar8,
                           (secp256k1_modinv64_signed62 *)psVar9,1);
        if (0 < iVar2) goto LAB_00147dc9;
        pcStack_198 = (code *)0x147d34;
        psVar14 = unaff_R14;
        r = (secp256k1_gej *)auStack_190;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_190,iVar8,
                           (secp256k1_modinv64_signed62 *)psVar9,0);
        if (iVar2 < 1) goto LAB_00147dce;
        pcStack_198 = (code *)0x147d4f;
        psVar14 = unaff_R14;
        r = (secp256k1_gej *)auStack_190;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_190,iVar8,
                           (secp256k1_modinv64_signed62 *)psVar9,1);
        if (-1 < iVar2) goto LAB_00147dd3;
        uVar1 = (int)auStack_190._104_8_ + 1;
        auStack_190._104_8_ = ZEXT48(uVar1);
        psVar10 = unaff_R12;
        if (uVar1 == 0xc) {
          return 0;
        }
      } while( true );
    }
  }
  pcStack_198 = secp256k1_ecmult_const;
  secp256k1_jacobi64_maybe_var_cold_17();
  psStack_1c0 = psVar9;
  psStack_1b8 = unaff_R12;
  psStack_1b0 = unaff_R13;
  psStack_1a8 = unaff_R14;
  psStack_1a0 = unaff_R15;
  pcStack_198 = unaff_RBP;
  secp256k1_ge_verify(psVar14);
  if (psVar14->infinity != 0) {
    secp256k1_gej_set_infinity(r);
    return extraout_EAX;
  }
  secp256k1_scalar_add(&sStack_ee8,a,&secp256k1_ecmult_const_K);
  secp256k1_scalar_half(&sStack_ee8,&sStack_ee8);
  secp256k1_scalar_split_lambda
            ((secp256k1_scalar *)auStack_ff8,(secp256k1_scalar *)auStack_fd8,&sStack_ee8);
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_ff8,(secp256k1_scalar *)auStack_ff8,
             &secp256k1_ecmult_const::S_OFFSET);
  psVar9 = (secp256k1_ge *)auStack_fd8;
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_fd8,(secp256k1_scalar *)auStack_fd8,
             &secp256k1_ecmult_const::S_OFFSET);
  uVar15 = 0x81;
  while( true ) {
    psVar10 = (secp256k1_ge *)auStack_ff8;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_ff8);
    if ((*(ulong *)(auStack_ff8 + (uVar15 >> 6) * 8) >> (uVar15 & 0x3f) & 1) != 0) break;
    psVar10 = (secp256k1_ge *)auStack_fd8;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_fd8);
    if ((*(ulong *)(auStack_fd8 + (uVar15 >> 6) * 8) & 1L << ((byte)uVar15 & 0x3f)) != 0)
    goto LAB_00148330;
    uVar1 = (int)uVar15 + 1;
    uVar15 = (ulong)uVar1;
    if (uVar1 == 0x100) {
      secp256k1_gej_set_ge(r,psVar14);
      secp256k1_ecmult_odd_multiples_table(0x10,&sStack_848,&sStack_ec8.x,&sStack_f18,r);
      secp256k1_ge_table_set_globalz(0x10,&sStack_848,&sStack_ec8.x);
      lVar12 = 0;
      do {
        secp256k1_ge_mul_lambda
                  ((secp256k1_ge *)((long)sStack_ec8.x.n + lVar12),
                   (secp256k1_ge *)((long)sStack_848.x.n + lVar12));
        lVar12 = lVar12 + 0x68;
      } while (lVar12 != 0x680);
      iVar2 = 0x19;
      psVar9 = (secp256k1_ge *)(auStack_fd8 + 0x50);
      do {
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_ff8);
        uVar1 = iVar2 * 5 + 4U >> 6;
        uVar13 = (uint)(iVar2 * 5) >> 6;
        bVar6 = (byte)(iVar2 * 5) & 0x3f;
        if (uVar1 == uVar13) {
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_ff8);
          uVar1 = uVar1 << 3;
          uVar27 = *(ulong *)(auStack_ff8 + uVar1) >> bVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_fd8);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_fd8);
          uStack_1008 = *(ulong *)(auStack_fd8 + uVar1) >> bVar6;
        }
        else {
          uVar15 = (ulong)(uVar13 << 3);
          uVar27 = *(ulong *)(auStack_ff8 + uVar15) >> bVar6 |
                   *(long *)(auStack_ff8 + uVar15 + 8) << 0x40 - bVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_fd8);
          uStack_1008 = *(ulong *)(auStack_fd8 + uVar15) >> bVar6 |
                        *(long *)(auStack_fd8 + uVar15 + 8) << 0x40 - bVar6;
        }
        uVar1 = (uint)((uVar27 & 0x10) == 0);
        uStack_f68 = sStack_848.x.n[4];
        iStack_f60 = sStack_848.x.magnitude;
        iStack_f5c = sStack_848.x.normalized;
        uStack_f78 = sStack_848.x.n[2];
        uStack_f70 = sStack_848.x.n[3];
        auStack_fd8._80_8_ = sStack_848.x.n[0];
        uStack_f80 = sStack_848.x.n[1];
        sStack_f58.n[0] = sStack_848.y.n[0];
        sStack_f58.n[1] = sStack_848.y.n[1];
        sStack_f58.n[4] = sStack_848.y.n[4];
        sStack_f58.magnitude = sStack_848.y.magnitude;
        sStack_f58.normalized = sStack_848.y.normalized;
        sStack_f58.n[2] = sStack_848.y.n[2];
        sStack_f58.n[3] = sStack_848.y.n[3];
        uVar15 = 1;
        psVar25 = asStack_7b0;
        do {
          uVar13 = (uint)(((-uVar1 ^ (uint)uVar27) & 0xf) == uVar15);
          secp256k1_fe_cmov((secp256k1_fe *)psVar9,psVar25 + -1,uVar13);
          secp256k1_fe_cmov(&sStack_f58,psVar25,uVar13);
          uVar15 = uVar15 + 1;
          psVar25 = (secp256k1_fe *)(psVar25[2].n + 1);
        } while (uVar15 != 0x10);
        uStack_f28 = 0;
        secp256k1_fe_verify(&sStack_f58);
        secp256k1_fe_verify_magnitude(&sStack_f58,1);
        auStack_fd8._32_8_ = 0x3ffffbfffff0bc - sStack_f58.n[0];
        auStack_fd8._40_8_ = 0x3ffffffffffffc - sStack_f58.n[1];
        auStack_fd8._48_8_ = 0x3ffffffffffffc - sStack_f58.n[2];
        auStack_fd8._56_8_ = 0x3ffffffffffffc - sStack_f58.n[3];
        auStack_fd8._64_8_ = 0x3fffffffffffc - sStack_f58.n[4];
        auStack_fd8._72_8_ = 2;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_fd8 + 0x20));
        secp256k1_fe_cmov(&sStack_f58,(secp256k1_fe *)(auStack_fd8 + 0x20),uVar1);
        if (iVar2 == 0x19) {
          secp256k1_gej_set_ge(r,psVar9);
        }
        else {
          iVar8 = 5;
          do {
            secp256k1_gej_double(r,r);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
          secp256k1_gej_add_ge(r,r,psVar9);
        }
        uVar1 = (uint)((uStack_1008 & 0x10) == 0);
        uStack_f68 = sStack_ec8.x.n[4];
        iStack_f60 = sStack_ec8.x.magnitude;
        iStack_f5c = sStack_ec8.x.normalized;
        uStack_f78 = sStack_ec8.x.n[2];
        uStack_f70 = sStack_ec8.x.n[3];
        auStack_fd8._80_8_ = sStack_ec8.x.n[0];
        uStack_f80 = sStack_ec8.x.n[1];
        sStack_f58.n[0] = sStack_ec8.y.n[0];
        sStack_f58.n[1] = sStack_ec8.y.n[1];
        sStack_f58.n[4] = sStack_ec8.y.n[4];
        sStack_f58.magnitude = sStack_ec8.y.magnitude;
        sStack_f58.normalized = sStack_ec8.y.normalized;
        sStack_f58.n[2] = sStack_ec8.y.n[2];
        sStack_f58.n[3] = sStack_ec8.y.n[3];
        uVar15 = 1;
        psVar25 = asStack_e30;
        do {
          uVar13 = (uint)(((-uVar1 ^ (uint)uStack_1008) & 0xf) == uVar15);
          secp256k1_fe_cmov((secp256k1_fe *)psVar9,psVar25 + -1,uVar13);
          secp256k1_fe_cmov(&sStack_f58,psVar25,uVar13);
          uVar15 = uVar15 + 1;
          psVar25 = (secp256k1_fe *)(psVar25[2].n + 1);
        } while (uVar15 != 0x10);
        uStack_f28 = 0;
        secp256k1_fe_verify(&sStack_f58);
        secp256k1_fe_verify_magnitude(&sStack_f58,1);
        auStack_fd8._32_8_ = 0x3ffffbfffff0bc - sStack_f58.n[0];
        auStack_fd8._40_8_ = 0x3ffffffffffffc - sStack_f58.n[1];
        auStack_fd8._48_8_ = 0x3ffffffffffffc - sStack_f58.n[2];
        auStack_fd8._56_8_ = 0x3ffffffffffffc - sStack_f58.n[3];
        auStack_fd8._64_8_ = 0x3fffffffffffc - sStack_f58.n[4];
        auStack_fd8._72_8_ = 2;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_fd8 + 0x20));
        secp256k1_fe_cmov(&sStack_f58,(secp256k1_fe *)(auStack_fd8 + 0x20),uVar1);
        secp256k1_gej_add_ge(r,r,psVar9);
        bVar28 = iVar2 != 0;
        iVar2 = iVar2 + -1;
      } while (bVar28);
      secp256k1_fe_mul(&r->z,&r->z,&sStack_f18);
      return extraout_EAX_00;
    }
  }
  secp256k1_ecmult_const_cold_1();
LAB_00148330:
  secp256k1_ecmult_const_cold_2();
  secp256k1_ge_verify(psVar9);
  psVar14 = psVar10;
  for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
    (psVar14->x).n[0] = (psVar9->x).n[0];
    psVar9 = (secp256k1_ge *)((long)psVar9 + (ulong)bVar6 * -0x10 + 8);
    psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar6 * -0x10 + 8);
  }
  secp256k1_fe_mul(&psVar10->x,&psVar10->x,&secp256k1_const_beta);
  secp256k1_ge_verify(psVar10);
  return extraout_EAX_01;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_square_var(const secp256k1_fe *x) {
    int ret;
    secp256k1_fe tmp = *x, sqrt;
    SECP256K1_FE_VERIFY(x);

    ret = secp256k1_fe_impl_is_square_var(x);
    secp256k1_fe_normalize_weak(&tmp);
    VERIFY_CHECK(ret == secp256k1_fe_sqrt(&sqrt, &tmp));
    return ret;
}